

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched,ggml_backend_t backend)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int buffer_id;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar1 = sched->n_backends;
  buffer_id = -1;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (sched->backends[lVar3] == backend) {
        buffer_id = (int)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if ((-1 < buffer_id) && (buffer_id < iVar1)) {
    sVar2 = ggml_gallocr_get_buffer_size(sched->galloc,buffer_id);
    return sVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x657,"GGML_ASSERT(%s) failed",
             "backend_index >= 0 && backend_index < sched->n_backends",in_R8,in_R9,backend);
}

Assistant:

size_t ggml_backend_sched_get_buffer_size(ggml_backend_sched_t sched, ggml_backend_t backend) {
    int backend_index = ggml_backend_sched_backend_id(sched, backend);
    GGML_ASSERT(backend_index >= 0 && backend_index < sched->n_backends);

    return ggml_gallocr_get_buffer_size(sched->galloc, backend_index);
}